

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ReserveLarge_Test::~RepeatedField_ReserveLarge_Test
          (RepeatedField_ReserveLarge_Test *this)

{
  RepeatedField_ReserveLarge_Test *this_local;
  
  ~RepeatedField_ReserveLarge_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedField, ReserveLarge) {
  const int old_size = 10;
  // This is a size we won't get by doubling:
  const int new_size = old_size * 3 + 1;

  // Reserving more than 2x current capacity should grow directly to that size.
  EXPECT_EQ(new_size, (internal::CalculateReserveSize<int, sizeof(void*)>(
                          old_size, new_size)));
}